

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::detail::_SubstrWriter::append(_SubstrWriter *this,csubstr s)

{
  bool bVar1;
  error_flags eVar2;
  size_t in_RDX;
  char *in_RSI;
  long *in_RDI;
  ro_substr rVar3;
  bool local_59;
  char *local_40;
  size_t local_38;
  char *local_28;
  size_t local_20;
  char **local_18;
  char *local_10;
  size_t local_8;
  
  local_28 = in_RSI;
  local_20 = in_RDX;
  rVar3 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3d6cc7);
  local_40 = rVar3.str;
  local_38 = rVar3.len;
  local_10 = local_40;
  local_8 = local_38;
  local_18 = &local_28;
  local_59 = local_28 < local_40 + local_38 && local_40 < local_28 + local_20;
  if (local_59) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3f0daf,(char *)0x492e,"check failed: %s","!s.overlaps(buf)");
  }
  if (in_RDI[2] + local_20 <= (ulong)in_RDI[1]) {
    memcpy((void *)(*in_RDI + in_RDI[2]),local_28,local_20);
  }
  in_RDI[2] = local_20 + in_RDI[2];
  return;
}

Assistant:

void append(csubstr s)
    {
        C4_ASSERT(!s.overlaps(buf));
        if(pos + s.len <= buf.len)
            memcpy(buf.str + pos, s.str, s.len);
        pos += s.len;
    }